

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Player.cpp
# Opt level: O2

string * __thiscall Player::GetCommData_abi_cxx11_(string *__return_storage_ptr__,Player *this)

{
  undefined1 *local_30;
  undefined8 local_28;
  undefined1 local_20 [16];
  
  std::__cxx11::stringbuf::str();
  local_30 = local_20;
  local_28 = 0;
  local_20[0] = 0;
  std::__cxx11::stringbuf::str((string *)&this->field_0x170);
  std::__cxx11::string::~string((string *)&local_30);
  return __return_storage_ptr__;
}

Assistant:

std::string Player::GetCommData() {
    std::string data = m_send_queue.str();
    m_send_queue.str(std::string());
    return data;
}